

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.hpp
# Opt level: O3

string * __thiscall CLI::Timer::to_string_abi_cxx11_(string *__return_storage_ptr__,Timer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  undefined8 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  paVar1 = &local_58.field_2;
  pcVar2 = (this->title_)._M_dataplus._M_p;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + (this->title_)._M_string_length);
  lVar3 = std::chrono::_V2::steady_clock::now();
  make_time_str_abi_cxx11_
            (&local_38,this,
             ((double)(lVar3 - (this->start_).__d.__r) / 1000000000.0) /
             (((double)CONCAT44(0x45300000,(int)(this->cycles >> 0x20)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)this->cycles) - 4503599627370496.0)));
  if ((this->time_print_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->time_print_)._M_invoker)
              (__return_storage_ptr__,(_Any_data *)&this->time_print_,&local_58,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    return __return_storage_ptr__;
  }
  uVar4 = std::__throw_bad_function_call();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  _Unwind_Resume(uVar4);
}

Assistant:

std::string to_string() const { return time_print_(title_, make_time_str()); }